

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall FfsParser::performSecondPass(FfsParser *this,UModelIndex *index)

{
  UModelIndex *this_00;
  bool bVar1;
  UINT32 UVar2;
  USTATUS UVar3;
  UByteArray UStack_88;
  UByteArray local_68;
  UByteArray local_48;
  
  bVar1 = UModelIndex::isValid(index);
  UVar3 = 1;
  if (bVar1) {
    this_00 = &this->lastVtf;
    bVar1 = UModelIndex::isValid(this_00);
    if (bVar1) {
      bVar1 = TreeModel::compressed(this->model,this_00);
      if (bVar1) {
        usprintf((CBString *)&UStack_88,
                 "%s: the last VTF appears inside compressed item, the image may be damaged",
                 "performSecondPass");
        msg(this,(CBString *)&UStack_88,this_00);
        Bstrlib::CBString::~CBString((CBString *)&UStack_88);
      }
      else {
        TreeModel::header(&UStack_88,this->model,this_00);
        TreeModel::body(&local_68,this->model,this_00);
        TreeModel::tail(&local_48,this->model,this_00);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&UStack_88);
        UVar2 = TreeModel::base(this->model,this_00);
        this->addressDiff =
             ((ulong)~UVar2 -
             (ulong)(uint)((int)local_68.d._M_string_length + (int)UStack_88.d._M_string_length +
                          (int)local_48.d._M_string_length)) + 1;
        parseResetVectorData(this);
        checkProtectedRanges(this,index);
        checkTeImageBase(this,index);
      }
      UVar3 = 0;
    }
  }
  return UVar3;
}

Assistant:

USTATUS FfsParser::performSecondPass(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid() || !lastVtf.isValid())
        return U_INVALID_PARAMETER;
    
    // Check for compressed lastVtf
    if (model->compressed(lastVtf)) {
        msg(usprintf("%s: the last VTF appears inside compressed item, the image may be damaged", __FUNCTION__), lastVtf);
        return U_SUCCESS;
    }
    
    // Calculate address difference
    const UINT32 vtfSize = (UINT32)(model->header(lastVtf).size() + model->body(lastVtf).size() + model->tail(lastVtf).size());
    addressDiff = 0xFFFFFFFFULL - model->base(lastVtf) - vtfSize + 1;
    
    // Parse reset vector data
    parseResetVectorData();
    
    // Find and parse FIT
    fitParser->parseFit(index);
    
    // Check protected ranges
    checkProtectedRanges(index);
    
    // Check TE files to have original or adjusted base
    checkTeImageBase(index);
    
    return U_SUCCESS;
}